

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O0

void __thiscall enact::ReturnStmt::~ReturnStmt(ReturnStmt *this)

{
  ReturnStmt *this_local;
  
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__ReturnStmt_0016a188;
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr(&this->value);
  Token::~Token(&this->keyword);
  Stmt::~Stmt(&this->super_Stmt);
  return;
}

Assistant:

~ReturnStmt() override = default;